

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::Arguments::AddArgument(Arguments *this,char *argument)

{
  vector<char_*,_std::allocator<char_*>_> *in_RDI;
  vector<char_*,_std::allocator<char_*>_> *in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffc8;
  
  std::vector<char_*,_std::allocator<char_*>_>::end(in_stack_ffffffffffffffb8);
  __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator-
            ((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *)
             in_stack_ffffffffffffffc8._M_current,(difference_type)in_RDI);
  __gnu_cxx::__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>>::
  __normal_iterator<char**>
            ((__normal_iterator<char_*const_*,_std::vector<char_*,_std::allocator<char_*>_>_> *)
             in_RDI,(__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *)
                    in_stack_ffffffffffffffb8);
  posix::StrDup((char *)0x5c6c8f);
  std::vector<char_*,_std::allocator<char_*>_>::insert
            (in_RDI,in_stack_ffffffffffffffc8,(value_type *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void AddArgument(const char* argument) {
    args_.insert(args_.end() - 1, posix::StrDup(argument));
  }